

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::
TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::TypedExpectation(TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *this,FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *owner,char *a_file,int a_line,string *a_source_text,
                  ArgumentMatcherTuple *m)

{
  DoDefaultAction local_45 [13];
  tuple<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *local_38;
  ArgumentMatcherTuple *m_local;
  string *a_source_text_local;
  char *pcStack_20;
  int a_line_local;
  char *a_file_local;
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *owner_local;
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  local_38 = m;
  m_local = (ArgumentMatcherTuple *)a_source_text;
  a_source_text_local._4_4_ = a_line;
  pcStack_20 = a_file;
  a_file_local = (char *)owner;
  owner_local = (FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)this;
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_003d4340;
  this->owner_ = (FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)a_file_local;
  std::
  tuple<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  ::tuple(&this->matchers_,local_38);
  A<std::tuple<std::__cxx11::string_const&>const&>();
  DoDefault();
  DoDefaultAction::operator_cast_to_Action(&this->repeated_action_,local_45);
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}